

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bool fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned_long,char>
               (appender *out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  appender aVar1;
  digit_grouping<char> grouping;
  
  digit_grouping<char>::digit_grouping(&grouping,loc,true);
  aVar1 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                    ((appender)
                     (out->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container,
                     value,prefix,specs,&grouping);
  (out->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container =
       (buffer<char> *)aVar1;
  std::__cxx11::string::~string((string *)&grouping);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}